

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineCam::Set_rotating_follower(ChLineCam *this,double mp,double md,double mb0)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  double dVar2;
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = mp;
  this->p = mp;
  this->d = md;
  this->b0 = mb0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = md * md;
  auVar3 = vfmadd231sd_fma(auVar6,auVar4._0_16_,auVar4._0_16_);
  auVar5._0_8_ = cos(mb0);
  auVar5._8_56_ = extraout_var;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar3._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mp * -2.0 * md;
  auVar1 = vfmadd213sd_fma(auVar3,auVar5._0_16_,auVar1);
  if (auVar1._0_8_ < 0.0) {
    dVar2 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar2 = auVar1._0_8_;
  }
  this->Rb = dVar2;
  return;
}

Assistant:

void ChLineCam::Set_rotating_follower(double mp, double md, double mb0) {
    p = mp;
    d = md;
    b0 = mb0;
    Rb = sqrt(p * p + d * d - 2 * p * d * cos(b0));
}